

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnSquare
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ChGaussPoint *pCVar4;
  undefined8 uVar5;
  ChLog *this_00;
  ChStreamOutAscii *this_01;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> c;
  ChVector<double> coord;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  ChVector<double> local_58;
  ulong local_38;
  
  local_58.m_data[2] = 0.0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints < 9) {
    if (nPoints == 1) {
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
      ChGaussPoint::ChGaussPoint(pCVar4,1,&local_58,4.0);
      *(GpVector->
       super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
       )._M_impl.super__Vector_impl_data._M_start = pCVar4;
      goto LAB_00604594;
    }
    if (nPoints == 4) {
      std::vector<double,_std::allocator<double>_>::resize(&local_78,2);
      std::vector<double,_std::allocator<double>_>::resize(&local_98,2);
      lVar8 = 0;
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.577350269189626;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.577350269189626;
      *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 1.0;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 1.0;
      uVar5 = CONCAT71((int7)((ulong)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 8),1);
      do {
        uVar10 = 0;
        local_38 = CONCAT44(local_38._4_4_,(int)uVar5);
        bVar3 = true;
        do {
          bVar6 = bVar3;
          local_58.m_data[0] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
          local_58.m_data[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
          dVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          dVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10];
          pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
          uVar10 = uVar10 | lVar8 * 2;
          ChGaussPoint::ChGaussPoint(pCVar4,(int)uVar10 + 1,&local_58,dVar2 * dVar1);
          (GpVector->
          super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar10] = pCVar4;
          uVar10 = 1;
          bVar3 = false;
        } while (bVar6);
        lVar8 = 1;
        uVar5 = 0;
      } while ((local_38 & 1) != 0);
      goto LAB_00604594;
    }
  }
  else {
    if (nPoints == 9) {
      std::vector<double,_std::allocator<double>_>::resize(&local_78,3);
      std::vector<double,_std::allocator<double>_>::resize(&local_98,3);
      uVar10 = 0;
      lVar8 = 0;
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.774596669241483;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.774596669241483;
      *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.555555555555555;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.888888888888888;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.555555555555555;
      do {
        lVar9 = 0;
        local_38 = uVar10;
        do {
          local_58.m_data[0] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
          local_58.m_data[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
          dVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          dVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
          pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar4,(int)uVar10 + 1,&local_58,dVar2 * dVar1);
          lVar9 = lVar9 + 1;
          (GpVector->
          super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar10] = pCVar4;
          uVar10 = uVar10 + 1;
        } while (lVar9 != 3);
        lVar8 = lVar8 + 1;
        uVar10 = local_38 + 3;
      } while (lVar8 != 3);
      goto LAB_00604594;
    }
    if (nPoints == 0x10) {
      std::vector<double,_std::allocator<double>_>::resize(&local_78,4);
      std::vector<double,_std::allocator<double>_>::resize(&local_98,4);
      iVar7 = 1;
      lVar9 = 0;
      lVar8 = 0;
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.861136311594053;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = -0.339981043584856;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.339981043584856;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.861136311594053;
      *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.347854845137454;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.652145154862546;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.652145154862546;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.347854845137454;
      do {
        lVar11 = 0;
        do {
          local_58.m_data[0] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
          local_58.m_data[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
          dVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          dVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar4,iVar7 + (int)lVar11,&local_58,dVar2 * dVar1);
          *(ChGaussPoint **)
           ((long)(GpVector->
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar11 * 8 + lVar9) = pCVar4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        lVar8 = lVar8 + 1;
        iVar7 = iVar7 + 4;
        lVar9 = lVar9 + 0x20;
      } while (lVar8 != 4);
      goto LAB_00604594;
    }
  }
  this_00 = GetLog();
  this_01 = ChStreamOutAscii::operator<<
                      (&this_00->super_ChStreamOutAscii,
                       "SetIntOnCube: unsupported number of integration points: ");
  ChStreamOutAscii::operator<<(this_01,nPoints);
LAB_00604594:
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnSquare(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    int i, j;
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    // GpVector = new std::vector<ChGaussPoint> [ nPoints ];
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            weight = 4.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        case 4:

            c.resize(2);
            w.resize(2);
            c[0] = -0.577350269189626;
            c[1] = 0.577350269189626;

            w[0] = 1.0;
            w[1] = 1.0;

            for (i = 0; i < 2; i++) {
                for (j = 0; j < 2; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    // ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
                    (*GpVector)[2 * i + j] = new ChGaussPoint(2 * i + j + 1, &coord, weight);
                }
            }

            break;

        case 9:

            c.resize(3);
            w.resize(3);
            c[0] = -0.774596669241483;
            c[1] = 0.0;
            c[2] = 0.774596669241483;

            w[0] = 0.555555555555555;
            w[1] = 0.888888888888888;
            w[2] = 0.555555555555555;

            for (i = 0; i < 3; i++) {
                for (j = 0; j < 3; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    (*GpVector)[3 * i + j] = new ChGaussPoint(3 * i + j + 1, &coord, weight);
                }
            }

            break;

        case 16:

            c.resize(4);
            w.resize(4);
            c[0] = -0.861136311594053;
            c[1] = -0.339981043584856;
            c[2] = 0.339981043584856;
            c[3] = 0.861136311594053;

            w[0] = 0.347854845137454;
            w[1] = 0.652145154862546;
            w[2] = 0.652145154862546;
            w[3] = 0.347854845137454;

            for (i = 0; i < 4; i++) {
                for (j = 0; j < 4; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    (*GpVector)[4 * i + j] = new ChGaussPoint(4 * i + j + 1, &coord, weight);
                }
            }

            break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}